

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj.c
# Opt level: O1

rk_s32 kmpp_obj_get_by_sptr(KmppObj *obj,KmppShmPtr *sptr,char *caller)

{
  undefined8 *puVar1;
  char *fmt;
  void *pvVar2;
  ulong uVar3;
  char *name;
  KmppObjs *pKVar4;
  KmppObjDefImpl *def;
  undefined8 *local_38;
  
  pKVar4 = objs;
  if (objs == (KmppObjs *)0x0) {
    if (((byte)kmpp_obj_debug & 1) == 0) {
      pKVar4 = (KmppObjs *)0x0;
    }
    else {
      pKVar4 = (KmppObjs *)0x0;
      _mpp_log_l(4,"kmpp_obj","kmpp objs srv not init at %s\n",(char *)0x0,caller);
    }
  }
  if (sptr == (KmppShmPtr *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = (sptr->field_0).uptr;
  }
  if ((obj == (KmppObj *)0x0 || sptr == (KmppShmPtr *)0x0) || pvVar2 == (void *)0x0) {
    _mpp_log_l(2,"kmpp_obj","invalid param obj %p sptr %p uptr %p at %s\n","kmpp_obj_get_by_sptr",
               obj,sptr,pvVar2,caller);
  }
  else {
    *obj = (KmppObj)0x0;
    if (pKVar4 != (KmppObjs *)0x0) {
      uVar3 = (ulong)*(uint *)((long)pvVar2 + (long)pKVar4->name_offset);
      if (uVar3 == 0) {
        _mpp_log_l(2,"kmpp_obj","invalid obj name offset %d at %s\n","kmpp_obj_get_by_sptr",0,caller
                  );
      }
      else {
        name = (char *)(uVar3 + (long)pKVar4->root);
        kmpp_objdef_get(&local_38,name);
        if (local_38 == (undefined8 *)0x0) {
          fmt = "failed to get objdef %p - %s at %s\n";
          caller = name;
        }
        else {
          puVar1 = (undefined8 *)mpp_osal_calloc("kmpp_obj_get_by_sptr",0x30);
          if (puVar1 != (undefined8 *)0x0) {
            *puVar1 = local_38[3];
            puVar1[1] = local_38;
            puVar1[2] = *local_38;
            *(undefined4 *)(puVar1 + 3) = 1;
            puVar1[4] = pvVar2;
            puVar1[5] = (long)pKVar4->entry_offset + (long)pvVar2;
            if (((byte)kmpp_obj_debug & 1) != 0) {
              _mpp_log_l(4,"kmpp_obj","get obj %s - %p by sptr [u:k] %llx:%llx at %s\n",(char *)0x0,
                         local_38[3],puVar1,(sptr->field_0).uaddr,(sptr->field_1).kaddr,caller);
            }
            *(undefined8 **)((long)(sptr->field_0).uptr + (long)pKVar4->priv_offset) = puVar1;
            *obj = puVar1;
            return 0;
          }
          fmt = "malloc obj impl %d failed at %s\n";
          name = (char *)0x30;
        }
        _mpp_log_l(2,"kmpp_obj",fmt,"kmpp_obj_get_by_sptr",name,caller);
      }
    }
  }
  return -1;
}

Assistant:

rk_s32 kmpp_obj_get_by_sptr(KmppObj *obj, KmppShmPtr *sptr, const char *caller)
{
    KmppObjs *p = get_objs(caller);
    KmppObjImpl *impl;
    KmppObjDefImpl *def;
    rk_u8 *uptr = sptr ? sptr->uptr : NULL;
    rk_s32 ret = rk_nok;

    if (!obj || !sptr || !uptr) {
        mpp_loge_f("invalid param obj %p sptr %p uptr %p at %s\n",
                   obj, sptr, uptr, caller);
        return ret;
    }

    *obj = NULL;

    if (!p)
        return ret;

    {
        rk_u32 val = *((rk_u32 *)(uptr + p->name_offset));
        char *str;

        if (!val) {
            mpp_loge_f("invalid obj name offset %d at %s\n", val, caller);
            return ret;
        }

        str = (char *)p->root + val;
        kmpp_objdef_get((KmppObjDef *)&def, str);
        if (!def) {
            mpp_loge_f("failed to get objdef %p - %s at %s\n", str, str, caller);
            return ret;
        }
    }

    impl = mpp_calloc(KmppObjImpl, 1);
    if (!impl) {
        mpp_loge_f("malloc obj impl %d failed at %s\n", sizeof(KmppObjImpl), caller);
        return ret;
    }

    impl->name = def->name;
    impl->def = def;
    impl->trie = def->trie;
    impl->need_free = 1;
    impl->shm = (KmppShmPtr *)uptr;
    impl->entry = uptr + p->entry_offset;

    obj_dbg_flow("get obj %s - %p by sptr [u:k] %llx:%llx at %s\n", def->name,
                 impl, sptr->uaddr, sptr->kaddr, caller);

    /* write userspace object address to share memory userspace private value */
    *(RK_U64 *)U64_TO_PTR(sptr->uaddr + p->priv_offset) = (RK_U64)(intptr_t)impl;

    *obj = impl;

    return rk_ok;
}